

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O1

char * Qiniu_Mac_Sign(Qiniu_Mac *self,char *data)

{
  uchar *key;
  char **ppcVar1;
  size_t sVar2;
  Qiniu_HMAC *self_00;
  char *s3;
  char *pcVar3;
  char **ppcVar4;
  size_t digest_len;
  char digest [65];
  size_t local_70;
  uchar local_68 [72];
  
  local_70 = 0x41;
  if (self == (Qiniu_Mac *)0x0) {
    ppcVar4 = &QINIU_ACCESS_KEY;
    ppcVar1 = &QINIU_SECRET_KEY;
  }
  else {
    ppcVar1 = &self->secretKey;
    ppcVar4 = &self->accessKey;
  }
  key = (uchar *)*ppcVar1;
  pcVar3 = ((Qiniu_Mac *)ppcVar4)->accessKey;
  sVar2 = strlen((char *)key);
  self_00 = Qiniu_HMAC_New(QINIU_DIGEST_TYPE_SHA1,key,(int)sVar2);
  sVar2 = strlen(data);
  Qiniu_HMAC_Update(self_00,data,(int)sVar2);
  Qiniu_HMAC_Final(self_00,local_68,&local_70);
  Qiniu_HMAC_Free(self_00);
  s3 = Qiniu_Memory_Encode((char *)local_68,local_70);
  pcVar3 = Qiniu_String_Concat3(pcVar3,":",s3);
  Qiniu_Free(s3);
  return pcVar3;
}

Assistant:

char *Qiniu_Mac_Sign(Qiniu_Mac *self, char *data)
{
	char *sign;
	char *encoded_digest;
	char digest[EVP_MAX_MD_SIZE + 1];
	size_t digest_len = sizeof(digest);

	Qiniu_Mac mac;

	if (self)
	{
		mac = *self;
	}
	else
	{
		mac.accessKey = QINIU_ACCESS_KEY;
		mac.secretKey = QINIU_SECRET_KEY;
	}

	Qiniu_HMAC *hmac = Qiniu_HMAC_New(QINIU_DIGEST_TYPE_SHA1, (const unsigned char *)mac.secretKey, (int)strlen(mac.secretKey));
	Qiniu_HMAC_Update(hmac, (const unsigned char *)data, (int)strlen(data));
	Qiniu_HMAC_Final(hmac, (unsigned char *)digest, &digest_len);
	Qiniu_HMAC_Free(hmac);

	encoded_digest = Qiniu_Memory_Encode(digest, digest_len);
	sign = Qiniu_String_Concat3(mac.accessKey, ":", encoded_digest);
	Qiniu_Free(encoded_digest);

	return sign;
}